

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O1

NameSet * __thiscall
wasm::BranchUtils::BranchSeekerCache::getBranches(BranchSeekerCache *this,Expression *curr)

{
  ulong uVar1;
  Index IVar2;
  __node_base_ptr p_Var3;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *this_00;
  Expression ***pppEVar4;
  ulong uVar5;
  NameSet *extraout_RDX;
  NameSet *extraout_RDX_00;
  NameSet *extraout_RDX_01;
  anon_class_8_1_ba1d7401 func;
  NameSet *extraout_RDX_02;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  Index IVar8;
  _Hash_node_base *p_Var9;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
  __it;
  Index index;
  undefined1 auStack_1b8 [8];
  NameSet selfBranches;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_e0;
  AbstractChildIterator<wasm::ChildIterator> local_b0;
  Expression *local_70;
  Expression *child;
  Expression *curr_local;
  NameSet currBranches;
  
  uVar1 = (this->branches)._M_h._M_bucket_count;
  uVar5 = (ulong)curr % uVar1;
  p_Var6 = (this->branches)._M_h._M_buckets[uVar5];
  p_Var3 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var9 = p_Var6->_M_nxt, p_Var3 = p_Var6, (Expression *)p_Var6->_M_nxt[1]._M_nxt != curr)) {
    while (p_Var6 = p_Var9, p_Var9 = p_Var6->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
      p_Var3 = (__node_base_ptr)0x0;
      if (((ulong)p_Var9[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var3 = p_Var6, (Expression *)p_Var9[1]._M_nxt == curr)) goto LAB_007b50e0;
    }
    p_Var3 = (__node_base_ptr)0x0;
  }
LAB_007b50e0:
  if (p_Var3 == (__node_base_ptr)0x0) {
    p_Var9 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var9 = p_Var3->_M_nxt;
  }
  if (p_Var9 == (_Hash_node_base *)0x0) {
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&currBranches;
    currBranches._M_t._M_impl._0_4_ = 0;
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    child = curr;
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_b0,curr);
    IVar8 = (int)((ulong)((long)local_b0.children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_b0.children.flexible.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) +
            (int)local_b0.children.usedFixed;
    func.ret = extraout_RDX;
    if (IVar8 != 0) {
      index = 0;
      do {
        IVar2 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_b0,index);
        pppEVar4 = local_b0.children.flexible.
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar2 - 4);
        if (IVar2 < 4) {
          pppEVar4 = local_b0.children.fixed._M_elems + IVar2;
        }
        local_70 = **pppEVar4;
        uVar1 = (this->branches)._M_h._M_bucket_count;
        uVar5 = (ulong)local_70 % uVar1;
        p_Var6 = (this->branches)._M_h._M_buckets[uVar5];
        p_Var3 = (__node_base_ptr)0x0;
        if ((p_Var6 != (__node_base_ptr)0x0) &&
           (p_Var3 = p_Var6, p_Var7 = p_Var6->_M_nxt,
           local_70 != (Expression *)p_Var6->_M_nxt[1]._M_nxt)) {
          while (p_Var9 = p_Var7->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
            p_Var3 = (__node_base_ptr)0x0;
            if (((ulong)p_Var9[1]._M_nxt % uVar1 != uVar5) ||
               (p_Var3 = p_Var7, p_Var7 = p_Var9, local_70 == (Expression *)p_Var9[1]._M_nxt))
            goto LAB_007b51d1;
          }
          p_Var3 = (__node_base_ptr)0x0;
        }
LAB_007b51d1:
        if (p_Var3 == (__node_base_ptr)0x0) {
          __it._M_cur = (__node_type *)0x0;
        }
        else {
          __it._M_cur = (__node_type *)p_Var3->_M_nxt;
        }
        if (__it._M_cur == (__node_type *)0x0) {
          auStack_1b8 = (undefined1  [8])0x0;
          selfBranches._M_t._M_impl._0_8_ = 0;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_e0._M_impl.super__Rb_tree_header._M_header;
          local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
          Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
          ::walk((Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
                  *)auStack_1b8,&local_70);
          if (currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)
          {
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::swap((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&curr_local,&local_e0);
          }
          else {
            std::
            _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<wasm::Name>>
                      ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                        *)&curr_local,
                       (_Rb_tree_const_iterator<wasm::Name>)
                       local_e0._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<wasm::Name>)&local_e0._M_impl.super__Rb_tree_header)
            ;
          }
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree(&local_e0);
          func.ret = extraout_RDX_01;
        }
        else {
          if (currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)
          {
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::swap((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&curr_local,
                   (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)((long)__it._M_cur + 0x10));
          }
          else {
            std::
            _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<wasm::Name>>
                      ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                        *)&curr_local,*(_Base_ptr *)((long)__it._M_cur + 0x28),
                       (_Base_ptr)((long)__it._M_cur + 0x18));
          }
          std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::erase((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)this,(const_iterator)__it._M_cur);
          func.ret = extraout_RDX_00;
        }
        index = index + 1;
      } while (index != IVar8);
    }
    if (local_b0.children.flexible.
        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.children.flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      func.ret = extraout_RDX_02;
    }
    selfBranches._M_t._M_impl._0_8_ = selfBranches._M_t._M_impl._0_8_ & 0xffffffff00000000;
    selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&selfBranches;
    selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&selfBranches;
    operateOnScopeNameUses<wasm::BranchUtils::getUniqueTargets(wasm::Expression*)::_lambda(wasm::Name&)_1_>
              ((BranchUtils *)child,(Expression *)auStack_1b8,func);
    if (currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) {
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::swap((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              *)&curr_local,
             (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              *)auStack_1b8);
    }
    else {
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<wasm::Name>>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)&curr_local,
                 (_Rb_tree_const_iterator<wasm::Name>)
                 selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (_Base_ptr)&selfBranches);
    }
    this_00 = &std::__detail::
               _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&child)->_M_t;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::clear(this_00);
    if (currBranches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
      (this_00->_M_impl).super__Rb_tree_header._M_header._M_color = currBranches._M_t._M_impl._0_4_;
      (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)currBranches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      (this_00->_M_impl).super__Rb_tree_header._M_header._M_left =
           currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (this_00->_M_impl).super__Rb_tree_header._M_header._M_right =
           currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      *(_Rb_tree_header **)(currBranches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 8) =
           &(this_00->_M_impl).super__Rb_tree_header;
      (this_00->_M_impl).super__Rb_tree_header._M_node_count =
           (size_t)currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      currBranches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&currBranches
      ;
      currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_1b8);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&curr_local);
  }
  else {
    this_00 = (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)(p_Var9 + 2);
  }
  return (NameSet *)this_00;
}

Assistant:

const NameSet& getBranches(Expression* curr) {
    auto iter = branches.find(curr);
    if (iter != branches.end()) {
      return iter->second;
    }
    NameSet currBranches;
    auto add = [&](NameSet& moreBranches) {
      // Make sure to do a fast swap for the first set of branches to arrive.
      // This helps the case of the first child being a block with a very large
      // set of names.
      if (currBranches.empty()) {
        currBranches.swap(moreBranches);
      } else {
        currBranches.insert(moreBranches.begin(), moreBranches.end());
      }
    };
    // Add from the children, which are hopefully cached.
    for (auto child : ChildIterator(curr)) {
      auto iter = branches.find(child);
      if (iter != branches.end()) {
        add(iter->second);
        // We are scanning the parent, which means we assume the child will
        // never be visited again.
        branches.erase(iter);
      } else {
        // The child was not cached. Scan it manually.
        BranchAccumulator childBranches;
        childBranches.walk(child);
        add(childBranches.branches);
        // Don't bother caching anything - we are scanning the parent, so the
        // child will presumably not be scanned again.
      }
    }
    // Finish with the parent's own branches.
    auto selfBranches = getUniqueTargets(curr);
    add(selfBranches);
    return branches[curr] = std::move(currBranches);
  }